

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileFunction *lff,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId,cmExecutionStatus *status)

{
  int *piVar1;
  cmMakefile *pcVar2;
  string *fileName;
  _Storage<cmMakefileProfilingData::RAII,_false> local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  cmListFileContext local_110;
  cmListFileContext local_a0;
  
  this->Makefile = mf;
  (this->ProfilingDataRAII).super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>.
  _M_payload.super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._M_engaged = false;
  fileName = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&mf->StateSnapshot);
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_138,
                   &deferId->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  cmListFileContext::FromListFileFunction
            (&local_110,lff,fileName,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_138);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_138);
  pcVar2 = this->Makefile;
  cmListFileContext::cmListFileContext(&local_a0,&local_110);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_148._M_value,
             (cmListFileContext *)&pcVar2->Backtrace);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&this->Makefile->Backtrace,
              (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&local_148._M_value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  cmListFileContext::~cmListFileContext(&local_a0);
  pcVar2 = this->Makefile;
  piVar1 = &pcVar2->RecursionDepth;
  *piVar1 = *piVar1 + 1;
  local_148 = (_Storage<cmMakefileProfilingData::RAII,_false>)status;
  std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
  emplace_back<cmExecutionStatus*>
            ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
             &pcVar2->ExecutionStatusStack,(cmExecutionStatus **)&local_148);
  cmake::CreateProfilingEntry<cmListFileFunction_const&,cmListFileContext_const&>
            ((cmake *)&local_148._M_value,
             (cmListFileFunction *)this->Makefile->GlobalGenerator->CMakeInstance,
             (cmListFileContext *)lff);
  std::_Optional_payload_base<cmMakefileProfilingData::RAII>::_M_move_assign
            ((_Optional_payload_base<cmMakefileProfilingData::RAII> *)&this->ProfilingDataRAII,
             (_Optional_payload_base<cmMakefileProfilingData::RAII> *)&local_148._M_value);
  std::_Optional_payload_base<cmMakefileProfilingData::RAII>::_M_reset
            ((_Optional_payload_base<cmMakefileProfilingData::RAII> *)&local_148._M_value);
  cmListFileContext::~cmListFileContext(&local_110);
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmListFileFunction const& lff,
                 cm::optional<std::string> deferId, cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromListFileFunction(
      lff, this->Makefile->StateSnapshot.GetExecutionListFile(),
      std::move(deferId));
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
#if !defined(CMAKE_BOOTSTRAP)
    this->ProfilingDataRAII =
      this->Makefile->GetCMakeInstance()->CreateProfilingEntry(lff, lfc);
#endif
  }